

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

string * QUtil::path_basename(string *__return_storage_ptr__,string *filename)

{
  string local_58 [32];
  long local_38;
  size_type pos;
  size_type len;
  char *local_20;
  char *pathsep;
  string *filename_local;
  string *last;
  
  local_20 = "/";
  len._7_1_ = 0;
  pathsep = (char *)filename;
  filename_local = __return_storage_ptr__;
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)filename);
  pos = std::__cxx11::string::length();
  while( true ) {
    if (pos < 2) {
      return __return_storage_ptr__;
    }
    local_38 = std::__cxx11::string::find_last_of((char *)__return_storage_ptr__,(ulong)local_20);
    if (local_38 != pos - 1) break;
    std::__cxx11::string::pop_back();
    pos = pos - 1;
  }
  if (local_38 == -1) {
    return __return_storage_ptr__;
  }
  std::__cxx11::string::substr((ulong)local_58,(ulong)__return_storage_ptr__);
  std::__cxx11::string::operator=((string *)__return_storage_ptr__,local_58);
  std::__cxx11::string::~string(local_58);
  return __return_storage_ptr__;
}

Assistant:

std::string
QUtil::path_basename(std::string const& filename)
{
#ifdef _WIN32
    char const* pathsep = "/\\";
#else
    char const* pathsep = "/";
#endif
    std::string last = filename;
    auto len = last.length();
    while (len > 1) {
        auto pos = last.find_last_of(pathsep);
        if (pos == len - 1) {
            last.pop_back();
            --len;
        } else if (pos == std::string::npos) {
            break;
        } else {
            last = last.substr(pos + 1);
            break;
        }
    }
    return last;
}